

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O2

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixUp
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  bool bVar1;
  ulong uVar2;
  student tmp;
  student local_60;
  
  student::student(&local_60,this->mData + idx);
  while (idx != 0) {
    uVar2 = idx - 1 >> 1;
    bVar1 = student::operator<(&local_60,this->mData + uVar2);
    if (bVar1) break;
    student::operator=(this->mData + idx,this->mData + uVar2);
    idx = uVar2;
  }
  student::operator=(this->mData + idx,&local_60);
  student::~student(&local_60);
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }